

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

long * __thiscall rangeless::fn::impl::maybe<long>::operator*(maybe<long> *this)

{
  if (this->m_empty != true) {
    return (long *)this;
  }
  __assert_fail("!m_empty",
                "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp"
                ,199,"T &rangeless::fn::impl::maybe<long>::operator*() [T = long]");
}

Assistant:

T& operator*() noexcept
        {
            assert(!m_empty);

#if __cplusplus >= 201703L
            return *std::launder(&m_value);
#else
            return m_value;
#endif
        }